

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O0

void anon_unknown.dwarf_762d5::writeRead
               (string *tempDir,pixelArray *array,int w,int h,int dx,int dy)

{
  int comp;
  int ys;
  int xs;
  string filename;
  int in_stack_000008a8;
  int in_stack_000008ac;
  int in_stack_000008b0;
  undefined1 in_stack_000008b7;
  char *in_stack_000008b8;
  pixelArray *in_stack_000008c0;
  int in_stack_000008d0;
  Compression in_stack_000008d8;
  int in_stack_000008e0;
  int in_stack_000008e8;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  int local_54;
  int local_50;
  int local_4c;
  string local_48 [64];
  
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  for (local_4c = 1; local_4c < 3; local_4c = local_4c + 1) {
    for (local_50 = 1; local_50 < 3; local_50 = local_50 + 1) {
      for (local_54 = 0; local_54 < 10; local_54 = local_54 + 1) {
        std::__cxx11::string::c_str();
        writeRead(in_stack_000008c0,in_stack_000008b8,(bool)in_stack_000008b7,in_stack_000008b0,
                  in_stack_000008ac,in_stack_000008a8,in_stack_000008d0,in_stack_000008d8,
                  in_stack_000008e0,in_stack_000008e8);
        if ((local_4c == 1) && (local_50 == 1)) {
          std::__cxx11::string::c_str();
          writeRead(in_stack_000008c0,in_stack_000008b8,(bool)in_stack_000008b7,in_stack_000008b0,
                    in_stack_000008ac,in_stack_000008a8,in_stack_000008d0,in_stack_000008d8,
                    in_stack_000008e0,in_stack_000008e8);
        }
      }
    }
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void
writeRead (
    const std::string& tempDir, pixelArray& array, int w, int h, int dx, int dy)
{
    std::string filename = tempDir + "imf_test_comp.exr";

    for (int xs = 1; xs <= 2; ++xs)
    {
        for (int ys = 1; ys <= 2; ++ys)
        {

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                writeRead (
                    array,
                    filename.c_str (),
                    false,
                    w * xs,
                    h * ys,
                    dx * xs,
                    dy * ys,
                    Compression (comp),
                    xs,
                    ys);

                if (xs == 1 && ys == 1)
                {
                    writeRead (
                        array,
                        filename.c_str (),
                        true,
                        w * xs,
                        h * ys,
                        dx * xs,
                        dy * ys,
                        Compression (comp),
                        xs,
                        ys);
                }
            }
        }
    }
}